

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int addk(FuncState *fs,TValue *key,TValue *v)

{
  ushort uVar1;
  Proto *o;
  lua_State *L;
  GCObject *pGVar2;
  ulong uVar3;
  int iVar4;
  TValue *pTVar5;
  int iVar6;
  LuaType *pLVar7;
  TValue *io;
  ulong uVar8;
  int iVar9;
  long lVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  
  o = fs->f;
  L = fs->ls->L;
  pTVar5 = luaH_set(L,fs->ls->h,key);
  if ((pTVar5->tt_ == 0x13) && (iVar9 = (pTVar5->value_).b, iVar9 < fs->nk)) {
    if ((((v->tt_ ^ o->k[iVar9].tt_) & 0x7f) == 0) &&
       (iVar4 = luaV_equalobj((lua_State *)0x0,o->k + iVar9,v), iVar4 != 0)) {
      return iVar9;
    }
  }
  iVar9 = fs->nk;
  iVar4 = o->sizek;
  lVar10 = (long)iVar9;
  (pTVar5->value_).i = lVar10;
  pTVar5->tt_ = 0x13;
  iVar6 = o->sizek;
  if (iVar6 <= iVar9) {
    pTVar5 = (TValue *)luaM_growaux_(L,o->k,&o->sizek,0x10,0xffffff,"constants");
    o->k = pTVar5;
    iVar6 = o->sizek;
  }
  pTVar5 = o->k;
  if (iVar4 < iVar6) {
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pLVar7 = &pTVar5[(long)iVar4 + 0x1f].tt_;
    auVar15 = vpbroadcastq_avx512f();
    uVar8 = 0;
    do {
      auVar16 = vpbroadcastq_avx512f();
      auVar17 = vporq_avx512f(auVar16,auVar14);
      uVar3 = vpcmpuq_avx512f(auVar17,auVar15,2);
      if ((uVar3 & 1) != 0) {
        pLVar7[-0xf8] = 0;
      }
      if ((uVar3 & 2) != 0) {
        pLVar7[-0xf0] = 0;
      }
      if ((uVar3 & 4) != 0) {
        pLVar7[-0xe8] = 0;
      }
      if ((uVar3 & 8) != 0) {
        pLVar7[-0xe0] = 0;
      }
      if ((uVar3 & 0x10) != 0) {
        pLVar7[-0xd8] = 0;
      }
      if ((uVar3 & 0x20) != 0) {
        pLVar7[-0xd0] = 0;
      }
      if ((uVar3 & 0x40) != 0) {
        pLVar7[-200] = 0;
      }
      if ((uVar3 & 0x80) != 0) {
        pLVar7[-0xc0] = 0;
      }
      auVar17 = vporq_avx512f(auVar16,auVar13);
      uVar3 = vpcmpuq_avx512f(auVar17,auVar15,2);
      if ((uVar3 & 1) != 0) {
        pLVar7[-0xb8] = 0;
      }
      if ((uVar3 & 2) != 0) {
        pLVar7[-0xb0] = 0;
      }
      if ((uVar3 & 4) != 0) {
        pLVar7[-0xa8] = 0;
      }
      if ((uVar3 & 8) != 0) {
        pLVar7[-0xa0] = 0;
      }
      if ((uVar3 & 0x10) != 0) {
        pLVar7[-0x98] = 0;
      }
      if ((uVar3 & 0x20) != 0) {
        pLVar7[-0x90] = 0;
      }
      if ((uVar3 & 0x40) != 0) {
        pLVar7[-0x88] = 0;
      }
      if ((uVar3 & 0x80) != 0) {
        pLVar7[-0x80] = 0;
      }
      auVar17 = vporq_avx512f(auVar16,auVar12);
      uVar3 = vpcmpuq_avx512f(auVar17,auVar15,2);
      if ((uVar3 & 1) != 0) {
        pLVar7[-0x78] = 0;
      }
      if ((uVar3 & 2) != 0) {
        pLVar7[-0x70] = 0;
      }
      if ((uVar3 & 4) != 0) {
        pLVar7[-0x68] = 0;
      }
      if ((uVar3 & 8) != 0) {
        pLVar7[-0x60] = 0;
      }
      if ((uVar3 & 0x10) != 0) {
        pLVar7[-0x58] = 0;
      }
      if ((uVar3 & 0x20) != 0) {
        pLVar7[-0x50] = 0;
      }
      if ((uVar3 & 0x40) != 0) {
        pLVar7[-0x48] = 0;
      }
      if ((uVar3 & 0x80) != 0) {
        pLVar7[-0x40] = 0;
      }
      auVar16 = vporq_avx512f(auVar16,auVar11);
      uVar3 = vpcmpuq_avx512f(auVar16,auVar15,2);
      if ((uVar3 & 1) != 0) {
        pLVar7[-0x38] = 0;
      }
      if ((uVar3 & 2) != 0) {
        pLVar7[-0x30] = 0;
      }
      if ((uVar3 & 4) != 0) {
        pLVar7[-0x28] = 0;
      }
      if ((uVar3 & 8) != 0) {
        pLVar7[-0x20] = 0;
      }
      if ((uVar3 & 0x10) != 0) {
        pLVar7[-0x18] = 0;
      }
      if ((uVar3 & 0x20) != 0) {
        pLVar7[-0x10] = 0;
      }
      if ((uVar3 & 0x40) != 0) {
        pLVar7[-8] = 0;
      }
      if ((uVar3 & 0x80) != 0) {
        *pLVar7 = 0;
      }
      uVar8 = uVar8 + 0x20;
      pLVar7 = pLVar7 + 0x100;
    } while ((((long)iVar6 - (long)iVar4) + 0x1fU & 0xffffffffffffffe0) != uVar8);
  }
  pGVar2 = (v->value_).gc;
  pTVar5[lVar10].value_.gc = pGVar2;
  uVar1 = v->tt_;
  pTVar5[lVar10].tt_ = uVar1;
  if ((short)uVar1 < 0) {
    if (((uVar1 & 0x7f) != (ushort)pGVar2->tt) ||
       ((L != (lua_State *)0x0 && ((pGVar2->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x1cc,"int addk(FuncState *, TValue *, TValue *)");
    }
    fs->nk = fs->nk + 1;
    if (((o->marked & 0x20) != 0) && ((((v->value_).gc)->marked & 0x18) != 0)) {
      if (9 < (o->tt & 0xe)) {
        __assert_fail("(((f)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x1ce,"int addk(FuncState *, TValue *, TValue *)");
      }
      luaC_barrier_(L,(GCObject *)o,(v->value_).gc);
    }
  }
  else {
    fs->nk = fs->nk + 1;
  }
  return iVar9;
}

Assistant:

static int addk (FuncState *fs, TValue *key, TValue *v) {
  lua_State *L = fs->ls->L;
  Proto *f = fs->f;
  TValue *idx = luaH_set(L, fs->ls->h, key);  /* index scanner table */
  int k, oldsize;
  if (ttisinteger(idx)) {  /* is there an index there? */
    k = cast_int(ivalue(idx));
    /* correct value? (warning: must distinguish floats from integers!) */
    if (k < fs->nk && ttype(&f->k[k]) == ttype(v) &&
                      luaV_rawequalobj(&f->k[k], v))
      return k;  /* reuse index */
  }
  /* constant not found; create a new entry */
  oldsize = f->sizek;
  k = fs->nk;
  /* numerical value does not need GC barrier;
     table has no metatable, so it does not need to invalidate cache */
  setivalue(idx, k);
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek) setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}